

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O3

bool __thiscall
DCanvas::SetTextureParms(DCanvas *this,DrawParms *parms,FTexture *img,double xx,double yy)

{
  double *w;
  double *y;
  undefined4 uVar1;
  ulong uVar2;
  undefined4 uVar3;
  DVector2 DVar4;
  int iVar5;
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  uint uVar9;
  int iVar10;
  int iVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double dVar16;
  
  if (img == (FTexture *)0x0) {
    return false;
  }
  parms->x = xx;
  parms->y = yy;
  uVar2._0_2_ = img->Width;
  uVar2._2_2_ = img->Height;
  uVar2._4_2_ = img->WidthMask;
  uVar2._6_2_ = *(undefined2 *)&img->field_0x3e;
  auVar6._8_4_ = 0;
  auVar6._0_8_ = uVar2;
  auVar6._12_2_ = uVar2._6_2_;
  auVar7._8_2_ = uVar2._4_2_;
  auVar7._0_8_ = uVar2;
  auVar7._10_4_ = auVar6._10_4_;
  auVar8._6_8_ = 0;
  auVar8._0_6_ = auVar7._8_6_;
  auVar15._0_8_ = (double)(ushort)(undefined2)uVar2;
  auVar15._8_8_ = (double)(int)CONCAT82(SUB148(auVar8 << 0x40,6),uVar2._2_2_);
  DVar4 = img->Scale;
  auVar15 = divpd(auVar15,(undefined1  [16])DVar4);
  parms->texwidth = (double)auVar15._0_8_;
  parms->texheight = (double)auVar15._8_8_;
  if (((parms->top == 2147483647.0) && (!NAN(parms->top))) || (parms->fortext == true)) {
    uVar9 = (uint)((double)(img->TopOffset * 2) / DVar4.Y);
    parms->top = (double)(int)((uVar9 & 1) + ((int)uVar9 >> 1));
  }
  if (((parms->left == 2147483647.0) && (!NAN(parms->left))) || (parms->fortext == true)) {
    uVar9 = (uint)((double)(img->LeftOffset * 2) / DVar4.X);
    parms->left = (double)(int)((uVar9 & 1) + ((int)uVar9 >> 1));
  }
  w = &parms->destwidth;
  dVar14 = auVar15._0_8_;
  if (((parms->destwidth == 2147483647.0) && (!NAN(parms->destwidth))) || (parms->fortext == true))
  {
    *w = dVar14;
  }
  dVar16 = auVar15._8_8_;
  if (((parms->destheight == 2147483647.0) && (!NAN(parms->destheight))) || (parms->fortext == true)
     ) {
    parms->destheight = dVar16;
  }
  y = &parms->y;
  iVar5 = parms->cleanmode;
  if (iVar5 < 0x400013a6) {
    if (iVar5 == 0x40001390) {
      dVar12 = (double)CleanXfac;
      dVar13 = (double)CleanYfac;
      uVar1 = this->Width;
      uVar3 = this->Height;
      parms->x = (double)(int)uVar1 * 0.5 + (xx + -160.0) * dVar12;
      parms->y = (double)(int)uVar3 * 0.5 + (yy + -100.0) * dVar13;
      parms->destwidth = dVar14 * dVar12;
      parms->destheight = dVar16 * dVar13;
      goto LAB_0048bfd9;
    }
    iVar10 = CleanYfac;
    iVar11 = CleanXfac;
    if ((iVar5 != 0x40001393) && (iVar10 = CleanYfac_1, iVar11 = CleanXfac_1, iVar5 != 0x40001394))
    goto LAB_0048bfd9;
    dVar12 = (double)iVar11;
    dVar13 = (double)iVar10;
  }
  else {
    if (1 < iVar5 + 0xbfffec5aU) {
      if (iVar5 == 0x400013ae) {
        parms->x = 0.0;
        parms->y = 0.0;
      }
      goto LAB_0048bfd9;
    }
    if (hud_scale.Value != true) {
      if (iVar5 == 0x400013a7) {
        dVar14 = (double)this->Width * 0.5;
LAB_0048c039:
        parms->x = dVar14 + xx;
      }
      else if (xx < 0.0) {
        dVar14 = (double)this->Width;
        goto LAB_0048c039;
      }
      if (yy < 0.0) {
        *y = (double)this->Height + yy;
      }
      goto LAB_0048bfd9;
    }
    dVar12 = (double)CleanXfac;
    parms->x = dVar12 * xx;
    if (iVar5 == 0x400013a7) {
      dVar13 = (double)this->Width * 0.5;
LAB_0048bf98:
      parms->x = dVar12 * xx + dVar13;
    }
    else if (xx < 0.0) {
      dVar13 = (double)this->Width;
      goto LAB_0048bf98;
    }
    dVar13 = (double)CleanYfac;
    *y = yy * dVar13;
    if (yy < 0.0) {
      *y = yy * dVar13 + (double)this->Height;
    }
  }
  *w = dVar14 * dVar12;
  parms->destheight = dVar16 * dVar13;
LAB_0048bfd9:
  dVar14 = parms->virtWidth;
  dVar16 = parms->virtHeight;
  if ((dVar14 == (double)this->Width) && (!NAN(dVar14) && !NAN((double)this->Width))) {
    if ((dVar16 == (double)this->Height) && (!NAN(dVar16) && !NAN((double)this->Height))) {
      return false;
    }
  }
  VirtualToRealCoords(this,&parms->x,y,w,&parms->destheight,dVar14,dVar16,parms->virtBottom,
                      parms->keepratio == 0);
  return false;
}

Assistant:

bool DCanvas::SetTextureParms(DrawParms *parms, FTexture *img, double xx, double yy) const
{
	if (img != NULL)
	{
		parms->x = xx;
		parms->y = yy;
		parms->texwidth = img->GetScaledWidthDouble();
		parms->texheight = img->GetScaledHeightDouble();
		if (parms->top == INT_MAX || parms->fortext)
		{
			parms->top = img->GetScaledTopOffset();
		}
		if (parms->left == INT_MAX || parms->fortext)
		{
			parms->left = img->GetScaledLeftOffset();
		}
		if (parms->destwidth == INT_MAX || parms->fortext)
		{
			parms->destwidth = img->GetScaledWidthDouble();
		}
		if (parms->destheight == INT_MAX || parms->fortext)
		{
			parms->destheight = img->GetScaledHeightDouble();
		}

		switch (parms->cleanmode)
		{
		default:
			break;

		case DTA_Clean:
			parms->x = (parms->x - 160.0) * CleanXfac + (Width * 0.5);
			parms->y = (parms->y - 100.0) * CleanYfac + (Height * 0.5);
			parms->destwidth = parms->texwidth * CleanXfac;
			parms->destheight = parms->texheight * CleanYfac;
			break;

		case DTA_CleanNoMove:
			parms->destwidth = parms->texwidth * CleanXfac;
			parms->destheight = parms->texheight * CleanYfac;
			break;

		case DTA_CleanNoMove_1:
			parms->destwidth = parms->texwidth * CleanXfac_1;
			parms->destheight = parms->texheight * CleanYfac_1;
			break;

		case DTA_Fullscreen:
			parms->x = parms->y = 0;
			break;

		case DTA_HUDRules:
		case DTA_HUDRulesC:
		{
			bool xright = parms->x < 0;
			bool ybot = parms->y < 0;

			if (hud_scale)
			{
				parms->x *= CleanXfac;
				if (parms->cleanmode == DTA_HUDRulesC)
					parms->x += Width * 0.5;
				else if (xright)
					parms->x = Width + parms->x;
				parms->y *= CleanYfac;
				if (ybot)
					parms->y = Height + parms->y;
				parms->destwidth = parms->texwidth * CleanXfac;
				parms->destheight = parms->texheight * CleanYfac;
			}
			else
			{
				if (parms->cleanmode == DTA_HUDRulesC)
					parms->x += Width * 0.5;
				else if (xright)
					parms->x = Width + parms->x;
				if (ybot)
					parms->y = Height + parms->y;
			}
			break;
		}
		}
		if (parms->virtWidth != Width || parms->virtHeight != Height)
		{
			VirtualToRealCoords(parms->x, parms->y, parms->destwidth, parms->destheight,
				parms->virtWidth, parms->virtHeight, parms->virtBottom, !parms->keepratio);
		}
	}

	return false;
}